

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

void __thiscall Fl_Tree::load(Fl_Tree *this,Fl_Preferences *prefs)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *local_c0;
  size_t sze_1;
  size_t sze;
  char *pcStack_78;
  int vn;
  char *val;
  char *pcStack_68;
  int kn;
  char *key;
  undefined1 local_50 [8];
  Fl_Preferences prefsChild;
  char *path;
  char *p;
  int pn;
  int n;
  int j;
  int i;
  Fl_Preferences *prefs_local;
  Fl_Tree *this_local;
  
  pcVar3 = Fl_Preferences::path(prefs);
  sVar4 = strlen(pcVar3);
  prefsChild.rootNode = (RootNode *)Fl_Preferences::path(prefs);
  iVar1 = strcmp((char *)prefsChild.rootNode,".");
  if (iVar1 == 0) {
    prefsChild.rootNode = (RootNode *)((long)&(prefsChild.rootNode)->prefs_ + 1);
  }
  else {
    prefsChild.rootNode = (RootNode *)((long)&(prefsChild.rootNode)->prefs_ + 2);
  }
  iVar1 = Fl_Preferences::groups(prefs);
  for (n = 0; n < iVar1; n = n + 1) {
    Fl_Preferences::Fl_Preferences((Fl_Preferences *)local_50,prefs,n);
    pcVar3 = Fl_Preferences::path((Fl_Preferences *)local_50);
    add(this,pcVar3 + 2);
    load(this,(Fl_Preferences *)local_50);
    Fl_Preferences::~Fl_Preferences((Fl_Preferences *)local_50);
  }
  iVar1 = Fl_Preferences::entries(prefs);
  for (n = 0; n < iVar1; n = n + 1) {
    pcVar3 = Fl_Preferences::entry(prefs,n);
    pcStack_68 = strdup(pcVar3);
    sVar5 = strlen(pcStack_68);
    val._4_4_ = (int)sVar5;
    for (pn = 0; pn < val._4_4_; pn = pn + 1) {
      if (pcStack_68[pn] == '/') {
        pcStack_68[pn] = '\\';
      }
    }
    Fl_Preferences::get(prefs,pcStack_68,&stack0xffffffffffffff88,"");
    sVar5 = strlen(pcStack_78);
    iVar2 = (int)sVar5;
    for (pn = 0; pn < iVar2; pn = pn + 1) {
      if (pcStack_78[pn] == '/') {
        pcStack_78[pn] = '\\';
      }
    }
    if (iVar2 < 0x28) {
      sVar5 = strlen(pcStack_68);
      path = (char *)malloc((long)(int)sVar4 + sVar5 + (long)iVar2 + 5);
      sprintf(path,"%s/%s = %s",prefsChild.rootNode,pcStack_68,pcStack_78);
    }
    else {
      sVar5 = strlen(pcStack_68);
      path = (char *)malloc((long)(int)sVar4 + sVar5 + 0x2d);
      sprintf(path,"%s/%s = %.40s...",prefsChild.rootNode,pcStack_68,pcStack_78);
    }
    if (*path == '/') {
      local_c0 = path + 1;
    }
    else {
      local_c0 = path;
    }
    add(this,local_c0);
    free(path);
    free(pcStack_78);
    free(pcStack_68);
  }
  return;
}

Assistant:

void Fl_Tree::load(Fl_Preferences &prefs) {
  int i, j, n, pn = (int) strlen(prefs.path());
  char *p;
  const char *path = prefs.path();
  if (strcmp(path, ".")==0)
    path += 1; // root path is empty
  else
    path += 2; // child path starts with "./"
  n = prefs.groups();
  for (i=0; i<n; i++) {
    Fl_Preferences prefsChild(prefs, i);
    add(prefsChild.path()+2); // children always start with "./"
    load(prefsChild);
  }
  n = prefs.entries();
  for (i=0; i<n; i++) {
    // We must remove all fwd slashes in the key and value strings. Replace with backslash.
    char *key = strdup(prefs.entry(i));
    int kn = (int) strlen(key);
    for (j=0; j<kn; j++) {
      if (key[j]=='/') key[j]='\\'; 
    }
    char *val;  prefs.get(key, val, "");
    int vn = (int) strlen(val);
    for (j=0; j<vn; j++) {
      if (val[j]=='/') val[j]='\\'; 
    }
    if (vn<40) {
      size_t sze = pn + strlen(key) + vn;
      p = (char*)malloc(sze+5);
      sprintf(p, "%s/%s = %s", path, key, val);
    } else {
      size_t sze = pn + strlen(key) + 40;
      p = (char*)malloc(sze+5);
      sprintf(p, "%s/%s = %.40s...", path, key, val);
    }
    add(p[0]=='/'?p+1:p);
    free(p);
    free(val);
    free(key);
  }
}